

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void swrenderer::R_DrawFogBoundary(int x1,int x2,short *uclip,short *dclip)

{
  fixed_t fVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  int local_70;
  int local_6c;
  int y_1;
  int y;
  int stop;
  int xr;
  int b1;
  int t1;
  uint8_t *fake_dc_colormap;
  uint8_t *basecolormapdata;
  int local_40;
  int lcolormap;
  int rcolormap;
  int b2;
  int t2;
  int x;
  double light;
  double lightstep;
  short *dclip_local;
  short *uclip_local;
  int x2_local;
  int x1_local;
  
  iVar2 = wallshade;
  light = (double)rw_lightstep;
  _t2 = (double)(rw_light + rw_lightstep * (float)((x2 - x1) + -1));
  b2 = x2 + -1;
  rcolormap = (int)uclip[b2];
  lcolormap = (int)dclip[b2];
  lightstep = (double)dclip;
  dclip_local = uclip;
  uclip_local._0_4_ = x2;
  uclip_local._4_4_ = x1;
  dVar5 = MIN<double>(24.0,_t2);
  fVar1 = FloatToFixed(dVar5);
  local_40 = clamp<int>(iVar2 - fVar1 >> 0x10,0,0x1f);
  fake_dc_colormap = (uint8_t *)*basecolormap;
  if (rcolormap < lcolormap) {
    fillshort(spanend + rcolormap,lcolormap - rcolormap,(WORD)b2);
  }
  R_SetColorMapLight((lighttable_t *)*basecolormap,(float)_t2,wallshade);
  iVar2 = wallshade;
  lVar4 = *basecolormap;
  dVar5 = MIN<double>(24.0,_t2);
  fVar1 = FloatToFixed(dVar5);
  iVar2 = clamp<int>(iVar2 - fVar1 >> 0x10,0,0x1f);
  _b1 = (uint8_t *)(lVar4 + (iVar2 << 8));
  iVar2 = b2;
  while (iVar3 = wallshade, b2 = iVar2 + -1, uclip_local._4_4_ <= b2) {
    xr = (int)dclip_local[b2];
    stop = (int)*(short *)((long)lightstep + (long)b2 * 2);
    _t2 = _t2 - (double)rw_lightstep;
    y = iVar2;
    dVar5 = MIN<double>(24.0,_t2);
    fVar1 = FloatToFixed(dVar5);
    basecolormapdata._4_4_ = clamp<int>(iVar3 - fVar1 >> 0x10,0,0x1f);
    iVar2 = rcolormap;
    if (basecolormapdata._4_4_ == local_40) {
      if (_b1 == fake_dc_colormap) {
        iVar3 = MIN<int>(xr,lcolormap);
        rcolormap = MAX<int>(iVar2,iVar3);
        iVar2 = lcolormap;
        iVar3 = MAX<int>(stop,rcolormap);
        lcolormap = MIN<int>(iVar2,iVar3);
      }
      else {
        y_1 = MIN<int>(xr,lcolormap);
        while (rcolormap < y_1) {
          local_6c = rcolormap;
          lVar4 = (long)rcolormap;
          rcolormap = rcolormap + 1;
          DrawerCommandQueue::
          QueueCommand<swrenderer::DrawFogBoundaryLinePalCommand,int&,int_const&,short&>
                    (&local_6c,&y,spanend + lVar4);
        }
        y_1 = MAX<int>(stop,rcolormap);
        while (y_1 < lcolormap) {
          local_70 = lcolormap + -1;
          lcolormap = local_70;
          DrawerCommandQueue::
          QueueCommand<swrenderer::DrawFogBoundaryLinePalCommand,int&,int_const&,short&>
                    (&local_70,&y,spanend + local_70);
        }
      }
      y_1 = MIN<int>(rcolormap,stop);
      while (xr < y_1) {
        spanend[xr] = (short)b2;
        xr = xr + 1;
      }
      y_1 = MAX<int>(lcolormap,rcolormap);
      while (y_1 < stop) {
        stop = stop + -1;
        spanend[stop] = (short)b2;
      }
    }
    else {
      if ((rcolormap < lcolormap) && (local_40 != 0)) {
        R_DrawFogBoundarySection(rcolormap,lcolormap,y);
      }
      if (xr < rcolormap) {
        rcolormap = xr;
      }
      if (lcolormap < stop) {
        lcolormap = stop;
      }
      if (rcolormap < lcolormap) {
        fillshort(spanend + rcolormap,lcolormap - rcolormap,(WORD)b2);
      }
      local_40 = basecolormapdata._4_4_;
      R_SetColorMapLight((lighttable_t *)*basecolormap,(float)_t2,wallshade);
      iVar2 = wallshade;
      lVar4 = *basecolormap;
      dVar5 = MIN<double>(24.0,_t2);
      fVar1 = FloatToFixed(dVar5);
      iVar2 = clamp<int>(iVar2 - fVar1 >> 0x10,0,0x1f);
      _b1 = (uint8_t *)(lVar4 + (iVar2 << 8));
    }
    rcolormap = (int)dclip_local[b2];
    lcolormap = (int)*(short *)((long)lightstep + (long)b2 * 2);
    iVar2 = b2;
  }
  if ((rcolormap < lcolormap) && (local_40 != 0)) {
    R_DrawFogBoundarySection(rcolormap,lcolormap,uclip_local._4_4_);
  }
  return;
}

Assistant:

void R_DrawFogBoundary(int x1, int x2, short *uclip, short *dclip)
	{
		// This is essentially the same as R_MapVisPlane but with an extra step
		// to create new horizontal spans whenever the light changes enough that
		// we need to use a new colormap.

		double lightstep = rw_lightstep;
		double light = rw_light + rw_lightstep*(x2 - x1 - 1);
		int x = x2 - 1;
		int t2 = uclip[x];
		int b2 = dclip[x];
		int rcolormap = GETPALOOKUP(light, wallshade);
		int lcolormap;
		uint8_t *basecolormapdata = basecolormap->Maps;

		if (b2 > t2)
		{
			fillshort(spanend + t2, b2 - t2, x);
		}

		R_SetColorMapLight(basecolormap->Maps, (float)light, wallshade);

		uint8_t *fake_dc_colormap = basecolormap->Maps + (GETPALOOKUP(light, wallshade) << COLORMAPSHIFT);

		for (--x; x >= x1; --x)
		{
			int t1 = uclip[x];
			int b1 = dclip[x];
			const int xr = x + 1;
			int stop;

			light -= rw_lightstep;
			lcolormap = GETPALOOKUP(light, wallshade);
			if (lcolormap != rcolormap)
			{
				if (t2 < b2 && rcolormap != 0)
				{ // Colormap 0 is always the identity map, so rendering it is
				  // just a waste of time.
					R_DrawFogBoundarySection(t2, b2, xr);
				}
				if (t1 < t2) t2 = t1;
				if (b1 > b2) b2 = b1;
				if (t2 < b2)
				{
					fillshort(spanend + t2, b2 - t2, x);
				}
				rcolormap = lcolormap;
				R_SetColorMapLight(basecolormap->Maps, (float)light, wallshade);
				fake_dc_colormap = basecolormap->Maps + (GETPALOOKUP(light, wallshade) << COLORMAPSHIFT);
			}
			else
			{
				if (fake_dc_colormap != basecolormapdata)
				{
					stop = MIN(t1, b2);
					while (t2 < stop)
					{
						int y = t2++;
						DrawerCommandQueue::QueueCommand<DrawFogBoundaryLinePalCommand>(y, xr, spanend[y]);
					}
					stop = MAX(b1, t2);
					while (b2 > stop)
					{
						int y = --b2;
						DrawerCommandQueue::QueueCommand<DrawFogBoundaryLinePalCommand>(y, xr, spanend[y]);
					}
				}
				else
				{
					t2 = MAX(t2, MIN(t1, b2));
					b2 = MIN(b2, MAX(b1, t2));
				}

				stop = MIN(t2, b1);
				while (t1 < stop)
				{
					spanend[t1++] = x;
				}
				stop = MAX(b2, t2);
				while (b1 > stop)
				{
					spanend[--b1] = x;
				}
			}

			t2 = uclip[x];
			b2 = dclip[x];
		}
		if (t2 < b2 && rcolormap != 0)
		{
			R_DrawFogBoundarySection(t2, b2, x1);
		}
	}